

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::insert
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  qsizetype *pqVar1;
  pair<double,_QVariant> *ppVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_88;
  double local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = t->first;
  ::QVariant::QVariant((QVariant *)&local_58,&t->second);
  bVar3 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size != 0;
  QArrayDataPointer<std::pair<double,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<double,_QVariant>_> *)this,(uint)(i == 0 && bVar3),n,
             (pair<double,_QVariant> **)0x0,(QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      ppVar2 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
               super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
      do {
        ppVar2[-1].first = local_60;
        ::QVariant::QVariant(&ppVar2[-1].second,(QVariant *)&local_58);
        ppVar2 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                 super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
        pqVar1 = &(this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                  super_QArrayDataPointer<std::pair<double,_QVariant>_>.size;
        *pqVar1 = *pqVar1 + 1;
        ppVar2 = ppVar2 + -1;
        (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
        super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr = ppVar2;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    ppVar2 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
             super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr + i;
    local_88.displaceTo = ppVar2 + n;
    local_88.bytes =
         ((this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size - i) * 0x28;
    local_88.data = (QArrayDataPointer<std::pair<double,_QVariant>_> *)this;
    local_88.displaceFrom = ppVar2;
    local_88.nInserts = n;
    memmove(local_88.displaceTo,ppVar2,local_88.bytes);
    if (n != 0) {
      do {
        ppVar2->first = local_60;
        ::QVariant::QVariant(&ppVar2->second,(QVariant *)&local_58);
        ppVar2 = local_88.displaceFrom + 1;
        n = n + -1;
        local_88.displaceFrom = ppVar2;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_88);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }